

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_1::createSingleTest<vkt::api::(anonymous_namespace)::ImageView>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters params)

{
  VkImageView obj;
  Resources res;
  Environment env;
  Deleter<vk::Handle<(vk::HandleType)13>_> DStack_140;
  VkImageViewCreateInfo local_128;
  Move<vk::Handle<(vk::HandleType)13>_> local_d8;
  Resources local_b0;
  Environment local_60;
  
  local_60.vkp = context->m_platformInterface;
  local_60.vkd = Context::getDeviceInterface(context);
  local_60.device = Context::getDevice(context);
  local_60.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_60.programBinaries = context->m_progCollection;
  local_60.allocationCallbacks = (VkAllocationCallbacks *)0x0;
  local_60.maxResourceConsumers = 1;
  ImageView::Resources::Resources(&local_b0,&local_60,&params);
  local_128.sType = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
  local_128.pNext = (void *)0x0;
  local_128.flags = 0;
  local_128.image.m_internal =
       local_b0.image.object.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  local_128.viewType = params.viewType;
  local_128.format = params.format;
  local_128.components.r = params.components.r;
  local_128.components.g = params.components.g;
  local_128.components.b = params.components.b;
  local_128.components.a = params.components.a;
  local_128.subresourceRange.aspectMask = params.subresourceRange.aspectMask;
  local_128.subresourceRange.baseMipLevel = params.subresourceRange.baseMipLevel;
  local_128.subresourceRange.levelCount = params.subresourceRange.levelCount;
  local_128.subresourceRange.baseArrayLayer = params.subresourceRange.baseArrayLayer;
  local_128.subresourceRange.layerCount = params.subresourceRange.layerCount;
  ::vk::createImageView
            (&local_d8,local_60.vkd,local_60.device,&local_128,local_60.allocationCallbacks);
  DStack_140.m_deviceIface._0_4_ =
       local_d8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface._0_4_;
  DStack_140.m_deviceIface._4_4_ =
       local_d8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface._4_4_;
  DStack_140.m_device =
       local_d8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
  DStack_140.m_allocator =
       local_d8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  obj.m_internal._4_4_ =
       local_d8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal._4_4_;
  obj.m_internal._0_4_ =
       (undefined4)local_d8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()(&DStack_140,obj);
  }
  local_128._0_8_ = (void *)((long)&local_128 + 0x10U);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"Ok","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_128._0_8_,
             (long)local_128.pNext + local_128._0_8_);
  if ((void *)local_128._0_8_ != (void *)((long)&local_128 + 0x10U)) {
    operator_delete((void *)local_128._0_8_,CONCAT44(local_128._20_4_,local_128.flags) + 1);
  }
  if (local_b0.memory.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal
      != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()
              (&local_b0.memory.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter,
               (VkDeviceMemory)
               local_b0.memory.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.
               m_internal);
  }
  local_b0.memory.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  local_b0.memory.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_b0.memory.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal = 0;
  local_b0.memory.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)0x0;
  if (local_b0.image.object.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal
      != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&local_b0.image.object.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
               (VkImage)local_b0.image.object.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                        object.m_internal);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSingleTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 1u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}